

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svggeometryelement.cpp
# Opt level: O1

Rect __thiscall lunasvg::SVGGeometryElement::strokeBoundingBox(SVGGeometryElement *this)

{
  pointer pSVar1;
  SVGMarkerPosition *markerPosition;
  pointer pSVar2;
  float extraout_XMM0_Da;
  float fVar3;
  float extraout_XMM0_Db;
  float fVar4;
  undefined8 in_XMM1_Qa;
  Rect strokeBoundingBox;
  Rect local_48;
  Rect local_38;
  
  (*(this->super_SVGGraphicsElement).super_SVGElement.super_SVGNode._vptr_SVGNode[0xb])();
  local_48.h = (float)((ulong)in_XMM1_Qa >> 0x20);
  local_48.y = extraout_XMM0_Db;
  local_48.x = extraout_XMM0_Da;
  local_48.w = (float)in_XMM1_Qa;
  if ((0.0 < (this->m_stroke).m_opacity) &&
     (((this->m_stroke).m_element != (SVGPaintElement *)0x0 ||
      (0xffffff < (this->m_stroke).m_color.m_value)))) {
    fVar3 = (this->m_strokeData).m_lineWidth * 0.5;
    fVar4 = fVar3;
    if ((this->m_strokeData).m_lineCap == Square) {
      fVar4 = fVar3 * 1.4142135;
    }
    if ((this->m_strokeData).m_lineJoin == Miter) {
      fVar3 = fVar3 * (this->m_strokeData).m_miterLimit;
    }
    if (fVar3 <= fVar4) {
      fVar3 = fVar4;
    }
    local_48.y = extraout_XMM0_Db - fVar3;
    local_48.x = extraout_XMM0_Da - fVar3;
    local_48.w = (float)in_XMM1_Qa + fVar3 + fVar3;
    local_48.h = fVar3 + fVar3 + local_48.h;
  }
  pSVar2 = (this->m_markerPositions).
           super__Vector_base<lunasvg::SVGMarkerPosition,_std::allocator<lunasvg::SVGMarkerPosition>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->m_markerPositions).
           super__Vector_base<lunasvg::SVGMarkerPosition,_std::allocator<lunasvg::SVGMarkerPosition>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar2 != pSVar1) {
    do {
      local_38 = SVGMarkerElement::markerBoundingBox
                           (pSVar2->m_element,&pSVar2->m_origin,pSVar2->m_angle,
                            (this->m_strokeData).m_lineWidth);
      local_48 = Rect::united(&local_48,&local_38);
      pSVar2 = pSVar2 + 1;
    } while (pSVar2 != pSVar1);
  }
  return local_48;
}

Assistant:

Rect SVGGeometryElement::strokeBoundingBox() const
{
    auto strokeBoundingBox = fillBoundingBox();
    if(m_stroke.isRenderable()) {
        float capLimit = m_strokeData.lineWidth() / 2.f;
        if(m_strokeData.lineCap() == LineCap::Square)
            capLimit *= PLUTOVG_SQRT2;
        float joinLimit = m_strokeData.lineWidth() / 2.f;
        if(m_strokeData.lineJoin() == LineJoin::Miter) {
            joinLimit *= m_strokeData.miterLimit();
        }

        strokeBoundingBox.inflate(std::max(capLimit, joinLimit));
    }

    for(const auto& markerPosition : m_markerPositions)
        strokeBoundingBox.unite(markerPosition.markerBoundingBox(m_strokeData.lineWidth()));
    return strokeBoundingBox;
}